

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution_test.cpp
# Opt level: O1

void flatbuffers::tests::UnionDeprecationTest(string *tests_data_path)

{
  ulong *puVar1;
  pointer pcVar2;
  void *pvVar3;
  bool bVar4;
  long lVar5;
  undefined8 *puVar6;
  long *plVar7;
  uint8_t *__first;
  StructDef *pSVar8;
  const_iterator cVar9;
  undefined1 *puVar10;
  size_type *psVar11;
  long *plVar12;
  int t;
  ulong uVar13;
  undefined8 uVar14;
  string *buf;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  string *buf_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string schema;
  string json;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaries [2];
  string jsonfiles [2];
  string schemas [2];
  IDLOptions idl_opts;
  Parser parser;
  ulong *local_c18;
  long local_c10;
  ulong local_c08;
  undefined8 uStack_c00;
  string local_bf8;
  string local_bd8;
  long *local_bb8;
  long local_bb0;
  long local_ba8;
  long lStack_ba0;
  string local_b98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b78;
  undefined8 uStack_b60;
  undefined8 local_b58 [2];
  string local_b48;
  long local_b28 [4];
  string local_b08;
  long local_ae8 [5];
  IDLOptions local_ac0;
  Parser local_7b0;
  
  lVar5 = 0x10;
  do {
    puVar10 = (undefined1 *)((long)&local_b08._M_dataplus._M_p + lVar5);
    *(undefined1 **)((long)local_b28 + lVar5 + 0x10) = puVar10;
    *(undefined8 *)((long)local_b28 + lVar5 + 0x18) = 0;
    *puVar10 = 0;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x50);
  lVar5 = 0x10;
  do {
    puVar10 = (undefined1 *)((long)&local_b48._M_dataplus._M_p + lVar5);
    *(undefined1 **)((long)local_b58 + lVar5) = puVar10;
    *(undefined8 *)((long)local_b58 + lVar5 + 8) = 0;
    *puVar10 = 0;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x50);
  local_b58[0] = 0;
  local_b58[1] = 0;
  local_b78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_b60 = 0;
  local_b78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  IDLOptions::IDLOptions(&local_ac0);
  local_ac0.lang_to_generate._1_1_ = local_ac0.lang_to_generate._1_1_ | 1;
  Parser::Parser(&local_7b0,&local_ac0);
  __result.container = &local_b78;
  t = 1;
  lVar5 = 0;
  do {
    local_c18 = &local_c08;
    pcVar2 = (tests_data_path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c18,pcVar2,pcVar2 + tests_data_path->_M_string_length);
    std::__cxx11::string::append((char *)&local_c18);
    NumToString<int>(&local_bf8,t);
    uVar13 = 0xf;
    if (local_c18 != &local_c08) {
      uVar13 = local_c08;
    }
    if (uVar13 < local_bf8._M_string_length + local_c10) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
        uVar14 = local_bf8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_bf8._M_string_length + local_c10) goto LAB_00159b9b;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_bf8,0,(char *)0x0,(ulong)local_c18);
    }
    else {
LAB_00159b9b:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_c18,(ulong)local_bf8._M_dataplus._M_p)
      ;
    }
    local_bb8 = &local_ba8;
    plVar7 = puVar6 + 2;
    if ((long *)*puVar6 == plVar7) {
      local_ba8 = *plVar7;
      lStack_ba0 = puVar6[3];
    }
    else {
      local_ba8 = *plVar7;
      local_bb8 = (long *)*puVar6;
    }
    local_bb0 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_bb8);
    local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_bd8.field_2._M_allocated_capacity = *psVar11;
      local_bd8.field_2._8_8_ = plVar7[3];
    }
    else {
      local_bd8.field_2._M_allocated_capacity = *psVar11;
      local_bd8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_bd8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_bb8 != &local_ba8) {
      operator_delete(local_bb8,local_ba8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
      operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
    }
    if (local_c18 != &local_c08) {
      operator_delete(local_c18,local_c08 + 1);
    }
    buf_00 = (string *)((long)&local_b08._M_dataplus._M_p + lVar5);
    bVar4 = LoadFile(local_bd8._M_dataplus._M_p,false,buf_00);
    TestEq<bool,bool>(true,bVar4,
                      "\'true\' != \'flatbuffers::LoadFile(schema.c_str(), false, &schemas[i])\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xa8,"");
    local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
    pcVar2 = (tests_data_path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_bf8,pcVar2,pcVar2 + tests_data_path->_M_string_length);
    std::__cxx11::string::append((char *)&local_bf8);
    NumToString<int>(&local_b98,t);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
      uVar14 = local_bf8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_b98._M_string_length + local_bf8._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
        uVar14 = local_b98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_b98._M_string_length + local_bf8._M_string_length)
      goto LAB_00159d7e;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_b98,0,(char *)0x0,(ulong)local_bf8._M_dataplus._M_p);
    }
    else {
LAB_00159d7e:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_bf8,(ulong)local_b98._M_dataplus._M_p)
      ;
    }
    local_c18 = &local_c08;
    puVar1 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar1) {
      local_c08 = *puVar1;
      uStack_c00 = puVar6[3];
    }
    else {
      local_c08 = *puVar1;
      local_c18 = (ulong *)*puVar6;
    }
    local_c10 = puVar6[1];
    *puVar6 = puVar1;
    puVar6[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_c18);
    local_bb8 = &local_ba8;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_ba8 = *plVar12;
      lStack_ba0 = plVar7[3];
    }
    else {
      local_ba8 = *plVar12;
      local_bb8 = (long *)*plVar7;
    }
    local_bb0 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_c18 != &local_c08) {
      operator_delete(local_c18,local_c08 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
      operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
      operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
    }
    buf = (string *)((long)&local_b48._M_dataplus._M_p + lVar5);
    bVar4 = LoadFile((char *)local_bb8,false,buf);
    TestEq<bool,bool>(true,bVar4,
                      "\'true\' != \'flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i])\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xab,"");
    bVar4 = Parser::Parse(&local_7b0,(buf_00->_M_dataplus)._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar4,"\'true\' != \'parser.Parse(schemas[i].c_str())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xad,"");
    bVar4 = Parser::Parse(&local_7b0,(buf->_M_dataplus)._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar4,"\'true\' != \'parser.Parse(jsonfiles[i].c_str())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xae,"");
    uVar13 = (ulong)local_7b0.builder_.buf_.size_;
    __first = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_7b0.builder_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(__result.container,uVar13);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (__first,__first + uVar13,__result);
    if (local_bb8 != &local_ba8) {
      operator_delete(local_bb8,local_ba8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
      operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
    }
    lVar5 = lVar5 + 0x20;
    __result.container = __result.container + 1;
    t = t + 1;
    if (lVar5 != 0x20) {
      local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd8,"Evolution.V2.Root","");
      pSVar8 = Parser::LookupStruct(&local_7b0,&local_bd8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
        operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
      }
      TestEq<bool,bool>(true,pSVar8 != (StructDef *)0x0,"\'nullptr\' == \'v2\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                        ,0xb7,"");
      local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd8,"j_type","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                      *)&pSVar8->fields,&local_bd8);
      if ((_Rb_tree_header *)cVar9._M_node ==
          &(pSVar8->fields).dict._M_t._M_impl.super__Rb_tree_header) {
        lVar5 = 0;
      }
      else {
        lVar5 = *(long *)(cVar9._M_node + 2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
        operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
      }
      TestEq<bool,bool>(true,lVar5 != 0,"\'nullptr\' == \'j_type_field\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                        ,0xb9,"");
      TestEq<bool,bool>(true,*(bool *)(lVar5 + 0x110),"\'true\' != \'j_type_field->deprecated\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                        ,0xba,"");
      Parser::~Parser(&local_7b0);
      IDLOptions::~IDLOptions(&local_ac0);
      lVar5 = 0x30;
      do {
        pvVar3 = *(void **)((long)&local_b98._M_string_length + lVar5);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)&local_b98.field_2 + lVar5 + 8) - (long)pvVar3);
        }
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != 0);
      lVar5 = -0x40;
      plVar7 = local_b28 + 2;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -4;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
      lVar5 = -0x40;
      plVar7 = local_ae8 + 2;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -4;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
      return;
    }
  } while( true );
}

Assistant:

void UnionDeprecationTest(const std::string &tests_data_path) {
  const int NUM_VERSIONS = 2;
  std::string schemas[NUM_VERSIONS];
  std::string jsonfiles[NUM_VERSIONS];
  std::vector<uint8_t> binaries[NUM_VERSIONS];

  flatbuffers::IDLOptions idl_opts;
  idl_opts.lang_to_generate |= flatbuffers::IDLOptions::kBinary;
  flatbuffers::Parser parser(idl_opts);

  // Load all the schema versions and their associated data.
  for (int i = 0; i < NUM_VERSIONS; ++i) {
    std::string schema = tests_data_path + "evolution_test/evolution_v" +
                         flatbuffers::NumToString(i + 1) + ".fbs";
    TEST_ASSERT(flatbuffers::LoadFile(schema.c_str(), false, &schemas[i]));
    std::string json = tests_data_path + "evolution_test/evolution_v" +
                       flatbuffers::NumToString(i + 1) + ".json";
    TEST_ASSERT(flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i]));

    TEST_ASSERT(parser.Parse(schemas[i].c_str()));
    TEST_ASSERT(parser.Parse(jsonfiles[i].c_str()));

    auto bufLen = parser.builder_.GetSize();
    auto buf = parser.builder_.GetBufferPointer();
    binaries[i].reserve(bufLen);
    std::copy(buf, buf + bufLen, std::back_inserter(binaries[i]));
  }

  auto v2 = parser.LookupStruct("Evolution.V2.Root");
  TEST_NOTNULL(v2);
  auto j_type_field = v2->fields.Lookup("j_type");
  TEST_NOTNULL(j_type_field);
  TEST_ASSERT(j_type_field->deprecated);
}